

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall
preprocessor_test_for_Test::~preprocessor_test_for_Test(preprocessor_test_for_Test *this)

{
  void *in_RDI;
  
  ~preprocessor_test_for_Test((preprocessor_test_for_Test *)0x111eb8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(preprocessor_test, for)
{
#define PREPROCESSOR_TEST_FOR(context, iterator, element) \
	context \
		PREPROCESSOR_STRINGIFY(iterator) \
			element \
		"-"

	const char for_str[] = PREPROCESSOR_FOR(PREPROCESSOR_TEST_FOR, "yeet", "a", "b", "c", "d", "e", "f");

#undef PREPROCESSOR_TEST_FOR

	EXPECT_STREQ(for_str, "yeet0a-yeet1b-yeet2c-yeet3d-yeet4e-yeet5f-");
}